

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void CopyOrSwap(uint32_t *src,int num_pixels,uint8_t *dst,int swap_on_big_endian)

{
  int iVar1;
  uint32_t val;
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint32_t *in_RDI;
  uint32_t argb;
  uint32_t *src_end;
  uint8_t *local_18;
  uint32_t *local_8;
  
  iVar1 = is_big_endian();
  if (iVar1 == in_ECX) {
    local_18 = in_RDX;
    local_8 = in_RDI;
    while (local_8 < in_RDI + in_ESI) {
      val = BSwap32(*local_8);
      WebPUint32ToMem(local_18,val);
      local_18 = local_18 + 4;
      local_8 = local_8 + 1;
    }
  }
  else {
    memcpy(in_RDX,in_RDI,(long)in_ESI << 2);
  }
  return;
}

Assistant:

static void CopyOrSwap(const uint32_t* WEBP_RESTRICT src, int num_pixels,
                       uint8_t* WEBP_RESTRICT dst, int swap_on_big_endian) {
  if (is_big_endian() == swap_on_big_endian) {
    const uint32_t* const src_end = src + num_pixels;
    while (src < src_end) {
      const uint32_t argb = *src++;
      WebPUint32ToMem(dst, BSwap32(argb));
      dst += sizeof(argb);
    }
  } else {
    memcpy(dst, src, num_pixels * sizeof(*src));
  }
}